

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_int>
* __thiscall
fmt::v10::
make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const,unsigned_short,int>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_int>
           *__return_storage_ptr__,v10 *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          unsigned_short *args_1,int *args_2)

{
  size_t sVar1;
  int *args_local_2;
  unsigned_short *args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  undefined1 local_119;
  char *local_118;
  size_t local_110;
  undefined1 local_103;
  undefined1 local_102;
  undefined1 local_101;
  bool formattable;
  bool formattable_pointer;
  v10 *pvStack_100;
  bool formattable_char;
  char *local_f8 [3];
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  longlong local_d8;
  size_t local_d0;
  bool formattable_2;
  bool formattable_pointer_2;
  bool formattable_char_2;
  longlong local_b8;
  size_t local_b0;
  v10 *local_80;
  undefined1 *local_78;
  basic_string_view<char> local_70;
  char **local_60;
  basic_string_view<char> local_58 [5];
  
  local_101 = 1;
  local_102 = 1;
  local_103 = 1;
  local_78 = &local_119;
  pvStack_100 = this;
  local_80 = this;
  local_70 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  local_118 = local_70.data_;
  local_110 = local_70.size_;
  local_58[0].data_ = local_70.data_;
  local_58[0].size_ = local_70.size_;
  local_60 = local_f8;
  local_f8[0] = basic_string_view<char>::data(local_58);
  sVar1 = basic_string_view<char>::size(local_58);
  local_d8._0_4_ = (uint)*(ushort *)args;
  local_b8._0_4_ = *(undefined4 *)args_1;
  (__return_storage_ptr__->data_).args_[0].field_0.string.data = local_f8[0];
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = sVar1;
  (__return_storage_ptr__->data_).args_[1].field_0.long_long_value = local_d8;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_d0;
  (__return_storage_ptr__->data_).args_[2].field_0.long_long_value = local_b8;
  (__return_storage_ptr__->data_).args_[2].field_0.string.size = local_b0;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}